

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,int width,int height)

{
  ImFontAtlasCustomRect local_28;
  
  local_28.X = 0xffff;
  local_28.Y = 0xffff;
  local_28.Font = (ImFont *)0x0;
  local_28.GlyphID = 0;
  local_28.GlyphAdvanceX = 0.0;
  local_28.GlyphOffset.x = 0.0;
  local_28.GlyphOffset.y = 0.0;
  local_28.Width = (unsigned_short)width;
  local_28.Height = (unsigned_short)height;
  ImVector<ImFontAtlasCustomRect>::push_back(&this->CustomRects,&local_28);
  return (this->CustomRects).Size + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}